

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O2

void CGL::SVGParser::parseTexture(XMLElement *xml)

{
  uint uVar1;
  char *pcVar2;
  ostream *poVar3;
  Texture *this;
  mapped_type *ppTVar4;
  int y;
  int x;
  uint uVar5;
  int k;
  int iVar6;
  uint width;
  uint height;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels_no_alpha;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  ulong local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string texid;
  
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"texid",(char *)0x0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texid,pcVar2,(allocator<char> *)&pixels_no_alpha);
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"filename",(char *)0x0);
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,pcVar2,(allocator<char> *)&local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &pixels_no_alpha,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dir_abi_cxx11_
                 ,&local_60);
  uVar1 = lodepng::decode(&pixels,&width,&height,(string *)&pixels_no_alpha,LCT_RGBA,8);
  std::__cxx11::string::~string((string *)&pixels_no_alpha);
  std::__cxx11::string::~string((string *)&local_60);
  if (uVar1 == 0) {
    pixels_no_alpha.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pixels_no_alpha.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pixels_no_alpha.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar1 = 0; uVar1 < height; uVar1 = uVar1 + 1) {
      for (uVar5 = 0; uVar5 < width; uVar5 = uVar5 + 1) {
        for (iVar6 = 0; iVar6 != 3; iVar6 = iVar6 + 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&pixels_no_alpha,
                     pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     (iVar6 + (width * uVar1 + uVar5) * 4));
        }
      }
    }
    this = (Texture *)operator_new(0x28);
    (this->mipmap).super__Vector_base<CGL::MipLevel,_std::allocator<CGL::MipLevel>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->mipmap).super__Vector_base<CGL::MipLevel,_std::allocator<CGL::MipLevel>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this->width = 0;
    this->height = 0;
    (this->mipmap).super__Vector_base<CGL::MipLevel,_std::allocator<CGL::MipLevel>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60._M_dataplus._M_p = (pointer)(ulong)width;
    local_68 = (ulong)height;
    Texture::init(this,(EVP_PKEY_CTX *)&pixels_no_alpha);
    ppTVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CGL::Texture_*>_>_>
                            *)(curr_svg + 0x20),&texid);
    *ppTVar4 = this;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pixels_no_alpha.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr," could not load image ");
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&texid);
  return;
}

Assistant:

void SVGParser::parseTexture( XMLElement* xml ) {
  string texid = xml->Attribute("texid");

  const char* file = xml->Attribute( "filename" );
  vector<unsigned char> pixels;
  unsigned int width, height;
  int err = lodepng::decode(pixels, width, height, dir + string(file));
  if (err) {
    cerr << " could not load image " << file << endl;
    return;
  }

  // Strip the alpha channel
  vector<unsigned char> pixels_no_alpha;
  for (int y = 0; y < height; ++y) {
    for (int x = 0; x < width; ++x) {
      for (int k = 0; k < 3; ++k) {
        pixels_no_alpha.push_back(pixels[4 * (y * width + x) + k]);
      }
    }
  }

  Texture *tex = new Texture();
  tex->init(pixels_no_alpha, width, height);
  curr_svg->textures[texid] = tex;

}